

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_deep_scanline_chunk
          (exr_context_t ctxt,int part_index,int y,void *packed_data,uint64_t packed_size,
          uint64_t unpacked_size,void *sample_data,uint64_t sample_data_size)

{
  int in_ESI;
  long in_RDI;
  uint64_t unaff_retaddr;
  exr_const_context_t_conflict in_stack_00000008;
  int in_stack_00000014;
  exr_priv_part_t part;
  exr_result_t rv;
  uint64_t in_stack_00000050;
  exr_const_context_t_conflict in_stack_ffffffffffffffb0;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffb0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffb0);
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if (*(int *)(*(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8) + 4) == 0) {
      internal_exr_unlock(in_stack_ffffffffffffffb0);
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x1d);
    }
    else {
      local_4 = write_scan_chunk((exr_context_t)unpacked_size,rv,part,in_stack_00000014,
                                 in_stack_00000008,unaff_retaddr,CONCAT44(part_index,y),ctxt,
                                 in_stack_00000050);
      internal_exr_unlock(in_stack_00000008);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_write_deep_scanline_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           y,
    const void*   packed_data,
    uint64_t      packed_size,
    uint64_t      unpacked_size,
    const void*   sample_data,
    uint64_t      sample_data_size)
{
    exr_result_t rv;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_SCANLINE)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_USE_SCAN_NONDEEP_WRITE));

    rv = write_scan_chunk (
        ctxt,
        part_index,
        part,
        y,
        packed_data,
        packed_size,
        unpacked_size,
        sample_data,
        sample_data_size);
    return EXR_UNLOCK_AND_RETURN (rv);
}